

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicBuildSeparable::Run(BasicBuildSeparable *this)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  GLuint local_98;
  GLuint pipeline;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined1 local_64 [8];
  vec4 data;
  GLuint local_44;
  byte local_3d;
  GLuint buffer;
  bool res;
  char *pcStack_38;
  GLuint p;
  char *cs [4];
  BasicBuildSeparable *this_local;
  
  pcStack_38 = "#version 430 core";
  cs[0] = "\nlayout(local_size_x = 1) in;\nvoid Run();\nvoid main() {\n  Run();\n}";
  cs[1] = 
  "\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput();\nvoid Run() {\n  g_output = CalculateOutput();\n}"
  ;
  cs[2] = "\nvec4 CalculateOutput() {\n  g_output = vec4(0);\n  return vec4(1, 2, 3, 4);\n}";
  buffer = glu::CallLogWrapper::glCreateShaderProgramv
                     (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x91b9,4,&stack0xffffffffffffffc8);
  local_3d = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,buffer,(bool *)0x0);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&local_44);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,local_44);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data.m_data + 2),0.0);
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data.m_data + 2),0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0x10,pfVar3,0x88e8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,buffer);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,1,1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_64);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,local_44);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_64,0);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,0x10,pfVar3);
  tcu::Vector<float,_4>::Vector(&local_74,(Vector<float,_4> *)local_64);
  tcu::Vector<float,_4>::Vector(&local_84,1.0,2.0,3.0,4.0);
  bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_74,&local_84);
  if (!bVar1) {
    anon_unknown_0::Output("Invalid value!\n");
    local_3d = 0;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff6c,0.0);
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&stack0xffffffffffffff6c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,0x10,pfVar3);
  glu::CallLogWrapper::glGenProgramPipelines
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&local_98);
  glu::CallLogWrapper::glUseProgramStages
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_98,0x20,buffer);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0);
  glu::CallLogWrapper::glBindProgramPipeline
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_98);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_64,0);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,0x10,pfVar3);
  tcu::Vector<float,_4>::Vector(&local_a8,(Vector<float,_4> *)local_64);
  tcu::Vector<float,_4>::Vector(&local_b8,1.0,2.0,3.0,4.0);
  bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_a8,&local_b8);
  if (!bVar1) {
    anon_unknown_0::Output("Invalid value!\n");
    local_3d = 0;
  }
  glu::CallLogWrapper::glDeleteProgramPipelines
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&local_98);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&local_44);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,buffer);
  iVar2 = -1;
  if ((local_3d & 1) == 1) {
    iVar2 = 0;
  }
  return (long)iVar2;
}

Assistant:

virtual long Run()
	{
		const char* const cs[4] = {
			"#version 430 core",

			NL "layout(local_size_x = 1) in;" NL "void Run();" NL "void main() {" NL "  Run();" NL "}",
			NL "layout(binding = 0, std430) buffer Output {" NL "  vec4 g_output;" NL "};" NL
			   "vec4 CalculateOutput();" NL "void Run() {" NL "  g_output = CalculateOutput();" NL "}",
			NL "vec4 CalculateOutput() {" NL "  g_output = vec4(0);" NL "  return vec4(1, 2, 3, 4);" NL "}"
		};

		const GLuint p   = glCreateShaderProgramv(GL_COMPUTE_SHADER, 4, cs);
		bool		 res = CheckProgram(p);

		GLuint buffer;
		glGenBuffers(1, &buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), &vec4(0.0f)[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(p);
		glDispatchCompute(1, 1, 1);

		vec4 data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &vec4(0.0f)[0]);

		GLuint pipeline;
		glGenProgramPipelines(1, &pipeline);
		glUseProgramStages(pipeline, GL_COMPUTE_SHADER_BIT, p);

		glUseProgram(0);
		glBindProgramPipeline(pipeline);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glDeleteProgramPipelines(1, &pipeline);
		glDeleteBuffers(1, &buffer);
		glDeleteProgram(p);

		return res == true ? NO_ERROR : ERROR;
	}